

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O2

bool __thiscall YAML::Stream::operator_cast_to_bool(Stream *this)

{
  reference pcVar1;
  
  if (*(int *)(this->m_input + *(long *)(*(long *)this->m_input + -0x18) + 0x20) == 0) {
    return true;
  }
  if ((this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur !=
      (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    pcVar1 = std::_Deque_iterator<char,_char_&,_char_*>::operator[]
                       (&(this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                         super__Deque_impl_data._M_start,0);
    return *pcVar1 != '\x04';
  }
  return false;
}

Assistant:

Stream::operator bool() const {
  return m_input.good() ||
         (!m_readahead.empty() && m_readahead[0] != Stream::eof());
}